

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_usdf.cpp
# Opt level: O2

bool P_ParseUSDF(int lumpnum,FileReader *lump,int lumplen)

{
  bool bVar1;
  USDFParser parse;
  UDMFParserBase local_130;
  
  UDMFParserBase::UDMFParserBase(&local_130);
  bVar1 = USDFParser::Parse((USDFParser *)&local_130,lumpnum,lump,lumplen);
  UDMFParserBase::~UDMFParserBase(&local_130);
  return bVar1;
}

Assistant:

bool P_ParseUSDF(int lumpnum, FileReader *lump, int lumplen)
{
	USDFParser parse;

	try
	{
		if (!parse.Parse(lumpnum, lump, lumplen))
		{
			// clean up the incomplete dialogue structures here
			return false;
		}
		return true;
	}
	catch(CRecoverableError &err)
	{
		Printf("%s", err.GetMessage());
		return false;
	}
}